

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O2

CVmTimeZone * __thiscall
CVmTimeZoneCache::parse_zone_posixTZ(CVmTimeZoneCache *this,char *name,size_t len)

{
  int iVar1;
  ZoneHashEntrySynth *this_00;
  CVmTimeZone *pCVar2;
  os_tzinfo_t desc;
  
  pCVar2 = (CVmTimeZone *)0x0;
  iVar1 = oss_parse_posix_tz(&desc,name,len,0);
  if (iVar1 != 0) {
    this_00 = (ZoneHashEntrySynth *)CVmHashTable::find(this->synth_tab_,name,len);
    if (this_00 == (ZoneHashEntrySynth *)0x0) {
      this_00 = (ZoneHashEntrySynth *)operator_new(0xa0);
      ZoneHashEntrySynth::ZoneHashEntrySynth(this_00,name,len,1,&desc);
      CVmHashTable::add(this->synth_tab_,(CVmHashEntry *)this_00);
    }
    pCVar2 = tz_from_hash(this,&this_00->super_ZoneHashEntry);
  }
  return pCVar2;
}

Assistant:

CVmTimeZone *CVmTimeZoneCache::parse_zone_posixTZ(
    VMG_ const char *name, size_t len)
{
    /* 
     *   Run it through the POSIX TZ parser.  Note that the zoneinfo format
     *   uses negative offsets going west (e.g., EST-5), in contrast to the
     *   original TZ format. 
     */
    os_tzinfo_t desc;
    if (oss_parse_posix_tz(&desc, name, len, FALSE))
    {
        /* got it - check to see if it's already defined */
        ZoneHashEntry *entry = (ZoneHashEntry *)synth_tab_->find(name, len);
        if (entry == 0)
        {
            /* it's not there yet - create a new entry for it */
            entry = new ZoneHashEntrySynth(name, len, TRUE, &desc);
            synth_tab_->add(entry);
        }

        /* find or create its timezone object */
        return tz_from_hash(vmg_ entry);
    }

    /* it's not ours */
    return 0;
}